

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZ.hpp
# Opt level: O2

void __thiscall
qclab::qgates::RotationZ<std::complex<float>_>::RotationZ
          (RotationZ<std::complex<float>_> *this,real_type theta)

{
  QRotationGate1<std::complex<float>_>::QRotationGate1
            (&this->super_QRotationGate1<std::complex<float>_>,0,theta,false);
  (this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_004cece0;
  return;
}

Assistant:

RotationZ( const real_type theta )
        : QRotationGate1< T >( 0 , theta )
        { }